

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::
ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::ConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler> *this
          ,int info)

{
  int num_items;
  int iVar1;
  int iVar2;
  StringRef name;
  StringRef name_00;
  StringRef SVar3;
  IntSuffixHandler suffix_handler;
  
  iVar2 = *(int *)(*(long *)(this + 8) + 4);
  iVar1 = *(int *)(*(long *)(this + 8) + 0x14);
  num_items = iVar1 + iVar2;
  iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::
          ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
                    *)this,1,iVar1 + 1 + iVar2);
  SVar3 = BinaryReader<mp::internal::IdentityConverter>::ReadString
                    (*(BinaryReader<mp::internal::IdentityConverter> **)this);
  if ((info & 4U) == 0) {
    name.size_ = (size_t)SVar3.data_;
    name.data_ = *(char **)(this + 0x10);
    TestNLHandler::OnIntSuffix((TestNLHandler *)&suffix_handler,name,(int)SVar3.size_,info & 3U);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::IntReader,TestNLHandler::SuffixHandler<int>>
              (this,iVar2,num_items,&suffix_handler);
    TestNLHandler::SuffixHandler<int>::~SuffixHandler(&suffix_handler);
  }
  else {
    name_00.size_ = (size_t)SVar3.data_;
    name_00.data_ = *(char **)(this + 0x10);
    TestNLHandler::OnDblSuffix((TestNLHandler *)&suffix_handler,name_00,(int)SVar3.size_,info & 3U);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::DoubleReader,TestNLHandler::SuffixHandler<double>>
              (this,iVar2,num_items,(SuffixHandler<double> *)&suffix_handler);
    TestNLHandler::SuffixHandler<double>::~SuffixHandler((SuffixHandler<double> *)&suffix_handler);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}